

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::analyzeFinal(Solver *this,Lit p,vec<Gluco::Lit> *out_conflict)

{
  vec<Gluco::Lit> *this_00;
  int iVar1;
  CRef CVar2;
  char *pcVar3;
  int *piVar4;
  Lit *pLVar5;
  Clause *this_01;
  uint local_44;
  int j;
  Clause *c;
  int local_30;
  Var local_2c;
  int local_28;
  Var x;
  int i;
  vec<Gluco::Lit> *out_conflict_local;
  Solver *this_local;
  Lit p_local;
  
  _i = out_conflict;
  out_conflict_local = (vec<Gluco::Lit> *)this;
  this_local._4_4_ = p.x;
  vec<Gluco::Lit>::clear(out_conflict,false);
  vec<Gluco::Lit>::push(_i,(Lit *)((long)&this_local + 4));
  iVar1 = decisionLevel(this);
  if (iVar1 != 0) {
    x = this_local._4_4_;
    iVar1 = Gluco::var(this_local._4_4_);
    pcVar3 = vec<char>::operator[](&this->seen,iVar1);
    *pcVar3 = '\x01';
    local_28 = vec<Gluco::Lit>::size(&this->trail);
    while( true ) {
      local_28 = local_28 + -1;
      iVar1 = local_28;
      piVar4 = vec<int>::operator[](&this->trail_lim,0);
      if (iVar1 < *piVar4) break;
      pLVar5 = vec<Gluco::Lit>::operator[](&this->trail,local_28);
      local_30 = pLVar5->x;
      local_2c = Gluco::var((Lit)local_30);
      pcVar3 = vec<char>::operator[](&this->seen,local_2c);
      if (*pcVar3 != '\0') {
        CVar2 = reason(this,local_2c);
        if (CVar2 == 0xffffffff) {
          iVar1 = level(this,local_2c);
          this_00 = _i;
          if (iVar1 < 1) {
            __assert_fail("level(x) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Glucose.cpp"
                          ,0x2fb,"void Gluco::Solver::analyzeFinal(Lit, vec<Lit> &)");
          }
          pLVar5 = vec<Gluco::Lit>::operator[](&this->trail,local_28);
          c._0_4_ = pLVar5->x;
          c._4_4_ = operator~(c._0_4_);
          vec<Gluco::Lit>::push(this_00,(Lit *)((long)&c + 4));
        }
        else {
          CVar2 = reason(this,local_2c);
          this_01 = ClauseAllocator::operator[](&this->ca,CVar2);
          iVar1 = Clause::size(this_01);
          for (local_44 = (uint)(iVar1 != 2); iVar1 = Clause::size(this_01), (int)local_44 < iVar1;
              local_44 = local_44 + 1) {
            pLVar5 = Clause::operator[](this_01,local_44);
            iVar1 = Gluco::var((Lit)pLVar5->x);
            iVar1 = level(this,iVar1);
            if (0 < iVar1) {
              pLVar5 = Clause::operator[](this_01,local_44);
              iVar1 = Gluco::var((Lit)pLVar5->x);
              pcVar3 = vec<char>::operator[](&this->seen,iVar1);
              *pcVar3 = '\x01';
            }
          }
        }
        pcVar3 = vec<char>::operator[](&this->seen,local_2c);
        *pcVar3 = '\0';
      }
    }
    iVar1 = Gluco::var(this_local._4_4_);
    pcVar3 = vec<char>::operator[](&this->seen,iVar1);
    *pcVar3 = '\0';
  }
  return;
}

Assistant:

void Solver::analyzeFinal(Lit p, vec<Lit>& out_conflict)
{
    out_conflict.clear();
    out_conflict.push(p);

    if (decisionLevel() == 0)
        return;

    seen[var(p)] = 1;

    for (int i = trail.size()-1; i >= trail_lim[0]; i--){
        Var x = var(trail[i]);
        if (seen[x]){
            if (reason(x) == CRef_Undef){
                assert(level(x) > 0);
                out_conflict.push(~trail[i]);
            }else{
                Clause& c = ca[reason(x)];
                //                for (int j = 1; j < c.size(); j++) Minisat (glucose 2.0) loop 
                // Bug in case of assumptions due to special data structures for Binary.
                // Many thanks to Sam Bayless (sbayless@cs.ubc.ca) for discover this bug.
                for (int j = ((c.size()==2) ? 0:1); j < c.size(); j++)
                    if (level(var(c[j])) > 0)
                        seen[var(c[j])] = 1;
            }  

            seen[x] = 0;
        }
    }

    seen[var(p)] = 0;
}